

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O0

void __thiscall Generator::registerClassInfoStrings(Generator *this)

{
  bool bVar1;
  const_iterator o;
  Generator *in_RDI;
  long in_FS_OFFSET;
  ClassInfoDef *c;
  add_const_t<QList<ClassInfoDef>_> *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  QByteArray *in_stack_ffffffffffffffb8;
  const_iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.i = (ClassInfoDef *)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = QList<ClassInfoDef>::begin((QList<ClassInfoDef> *)in_RDI);
  o = QList<ClassInfoDef>::end((QList<ClassInfoDef> *)in_RDI);
  while( true ) {
    bVar1 = QList<ClassInfoDef>::const_iterator::operator!=(&local_10,o);
    if (!bVar1) break;
    QList<ClassInfoDef>::const_iterator::operator*(&local_10);
    strreg(in_RDI,in_stack_ffffffffffffffb8);
    strreg(in_RDI,in_stack_ffffffffffffffb8);
    QList<ClassInfoDef>::const_iterator::operator++(&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Generator::registerClassInfoStrings()
{
    for (const ClassInfoDef &c : std::as_const(cdef->classInfoList)) {
        strreg(c.name);
        strreg(c.value);
    }
}